

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CMoveStatement *statement)

{
  initializer_list<const_IRT::INode_*> __l;
  allocator_type local_c9;
  _Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_c8;
  string local_b0;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  ChildrenAnswers answers;
  ChildrenAnswers local_48;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CMoveStatement::Target(statement);
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CMoveStatement::Source(statement);
  __l._M_len = 2;
  __l._M_array = (iterator)&answers;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&children,__l,&local_c9);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_c8,&children)
  ;
  VisitChildren(&answers,this,
                (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_c8);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&local_c8);
  ChildrenAnswers::ChildrenAnswers(&local_48,&answers);
  AddChildrenAnswers(this,&local_48);
  ChildrenAnswers::~ChildrenAnswers(&local_48);
  std::__cxx11::string::string((string *)&local_b0,"Move",(allocator *)&local_c9);
  AddLabel(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers(&answers);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CMoveStatement &statement ) {
    std::vector<const IRT::INode *> children = { statement.Target( ), statement.Source( ) };
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Move" );
    ++lastVisited;
}